

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O2

void __thiscall Node::ScanMap(Node *this)

{
  Node *this_00;
  int iVar1;
  uint skipprefix;
  string tempname;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  VariableStruct ThisVar;
  
  std::__cxx11::string::string((string *)&local_c8,(string *)&this->Tree[0]->TextValue);
  VariableStruct::VariableStruct(&ThisVar,&local_c8,VARTYPE_STRUCT,VARCLASS_NONE,1,0);
  std::__cxx11::string::~string((string *)&local_c8);
  genname(&tempname,&ThisVar.BasicName);
  iVar1 = VariableList::LookupReserved(Variables,&tempname);
  if (iVar1 != 0) {
    iVar1 = Variables->vcount;
    Variables->vcount = iVar1 + 1;
    std::__cxx11::to_string(&local_108,iVar1);
    std::operator+(&local_e8,"_V",&local_108);
    std::__cxx11::string::append((string *)&tempname);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
  }
  std::__cxx11::string::_M_assign((string *)&ThisVar.CName);
  VariableList::Append(Variables,&ThisVar,0);
  VariableList::Fixup(Variables);
  this_00 = this->Tree[1];
  if (this_00 != (Node *)0x0) {
    skipprefix = 0;
    if (this_00->Type == 0x1d8) {
      skipprefix = (uint)(this_00->Block[0] == (Node *)0x0);
    }
    ScanOneMap(this_00,&ThisVar,skipprefix);
  }
  std::__cxx11::string::~string((string *)&tempname);
  VariableStruct::~VariableStruct(&ThisVar);
  return;
}

Assistant:

void Node::ScanMap(void)
{
	VariableStruct ThisVar(Tree[0]->TextValue,
		VARTYPE_STRUCT, VARCLASS_NONE, true);

	//
	// We need to name the map so we can use the nasme as a prefix.
	// This will likely cause problems with ocerlapping MAP/COMMON
	// statements, but it's better than nothing.
	//
	std::string tempname = genname(ThisVar.BasicName);
	if (Variables->LookupReserved(tempname) == false)
	{
		//tempName = tempname;
	}
	else
	{
		tempname += "_V" + std::to_string(Variables->vcount++);
	}
	ThisVar.CName = tempname;

	Variables->Append(ThisVar);
	Variables->Fixup();
 
	if (Tree[1] != 0)
	{
		Tree[1]->ScanOneMap(&ThisVar,
			Tree[1]->Type == BAS_V_DEFINEVAR &&
			Tree[1]->Block[0] == 0);
	}
}